

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall
testing::internal::anon_unknown_28::PositiveAndNegativeUnitTestFilter::MatchesTest
          (PositiveAndNegativeUnitTestFilter *this,string *test_suite_name,string *test_name)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string local_68;
  size_type *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  pcVar1 = (test_suite_name->_M_dataplus)._M_p;
  local_48 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + test_suite_name->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_48,(ulong)(test_name->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar3[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_68._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  bVar2 = UnitTestFilter::MatchesName(&this->positive_filter_,&local_68);
  if (bVar2) {
    bVar2 = UnitTestFilter::MatchesName(&this->negative_filter_,&local_68);
    bVar2 = !bVar2;
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != &__str._M_string_length) {
    operator_delete(local_48,__str._M_string_length + 1);
  }
  return bVar2;
}

Assistant:

bool MatchesTest(const std::string& test_suite_name,
                   const std::string& test_name) const {
    return MatchesName(test_suite_name + "." + test_name);
  }